

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O0

PVIP_category_t PVIP_node_category(PVIP_node_type_t type)

{
  PVIP_category_t local_c;
  PVIP_node_type_t type_local;
  
  if (type == PVIP_NODE_INT) {
    return PVIP_CATEGORY_INT;
  }
  if (type == PVIP_NODE_NUMBER) {
LAB_001032ba:
    local_c = PVIP_CATEGORY_NUMBER;
  }
  else {
    if (((((type != PVIP_NODE_IDENT) && (type != PVIP_NODE_STRING)) && (type != PVIP_NODE_VARIABLE))
        && ((type != PVIP_NODE_REGEXP && (type != PVIP_NODE_PERL5_REGEXP)))) &&
       ((type != PVIP_NODE_ATTRIBUTE_VARIABLE &&
        ((type != PVIP_NODE_PATH && (type != PVIP_NODE_SLANGS)))))) {
      if (type == PVIP_NODE_COMPLEX) goto LAB_001032ba;
      if (type != PVIP_NODE_UNICODE_CHAR) {
        return PVIP_CATEGORY_CHILDREN;
      }
    }
    local_c = PVIP_CATEGORY_STRING;
  }
  return local_c;
}

Assistant:

PVIP_category_t PVIP_node_category(PVIP_node_type_t type) {
    switch (type) {
    case PVIP_NODE_STRING:
    case PVIP_NODE_VARIABLE:
    case PVIP_NODE_IDENT:
    case PVIP_NODE_REGEXP:
    case PVIP_NODE_PERL5_REGEXP:
    case PVIP_NODE_ATTRIBUTE_VARIABLE:
    case PVIP_NODE_PATH:
    case PVIP_NODE_SLANGS:
    case PVIP_NODE_UNICODE_CHAR:
        return PVIP_CATEGORY_STRING;
    case PVIP_NODE_INT:
        return PVIP_CATEGORY_INT;
    case PVIP_NODE_NUMBER:
    case PVIP_NODE_COMPLEX:
        return PVIP_CATEGORY_NUMBER;
    default:
        return PVIP_CATEGORY_CHILDREN;
    }
}